

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    if (*(long *)(*(long *)((long)pointer + 0x198) + 0x18) == (long)pointer + 0x188) {
      *(undefined8 *)(*(long *)((long)pointer + 0x198) + 0x18) = 0;
    }
    Canceler::~Canceler((Canceler *)((long)pointer + 0x1c0));
    if (*(int *)((long)pointer + 0x1a0) == 1) {
      *(undefined4 *)((long)pointer + 0x1a0) = 0;
    }
    if (*(int *)((long)pointer + 0x1a0) == 2) {
      *(undefined4 *)((long)pointer + 0x1a0) = 0;
    }
    if (*(int *)((long)pointer + 0x1a0) == 3) {
      *(undefined4 *)((long)pointer + 0x1a0) = 0;
    }
    if (*(char *)((long)pointer + 0x18) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x20));
    }
    operator_delete(pointer,0x1c8);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }